

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

ISAKind __thiscall llvm::ARM::parseArchISA(ARM *this,StringRef Arch)

{
  int iVar1;
  ISAKind *pIVar2;
  AlignedCharArray<4UL,_4UL> AVar3;
  char *pcVar4;
  Optional<llvm::ARM::ISAKind> local_20;
  
  pcVar4 = Arch.Data;
  AVar3.buffer[0] = '\x03';
  AVar3.buffer[1] = '\0';
  AVar3.buffer[2] = '\0';
  AVar3.buffer[3] = '\0';
  if (((char *)0x6 < pcVar4) && (iVar1 = bcmp(this,"aarch64",7), iVar1 == 0)) goto LAB_00195fd3;
  if ((char *)0x4 < pcVar4) {
    iVar1 = bcmp(this,"arm64",5);
    if (iVar1 == 0) goto LAB_00195fd3;
    if (((char *)0x4 < pcVar4) && (iVar1 = bcmp(this,"thumb",5), iVar1 == 0)) {
      AVar3.buffer[0] = '\x02';
      AVar3.buffer[1] = '\0';
      AVar3.buffer[2] = '\0';
      AVar3.buffer[3] = '\0';
      goto LAB_00195fd3;
    }
  }
  if (pcVar4 < (char *)0x3) {
    return INVALID;
  }
  iVar1 = bcmp(this,"arm",3);
  if (iVar1 != 0) {
    return INVALID;
  }
  AVar3.buffer[0] = '\x01';
  AVar3.buffer[1] = '\0';
  AVar3.buffer[2] = '\0';
  AVar3.buffer[3] = '\0';
LAB_00195fd3:
  local_20.Storage.hasVal = true;
  local_20.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
       (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar3.buffer;
  pIVar2 = Optional<llvm::ARM::ISAKind>::getPointer(&local_20);
  return *pIVar2;
}

Assistant:

ARM::ISAKind ARM::parseArchISA(StringRef Arch) {
  return StringSwitch<ARM::ISAKind>(Arch)
      .StartsWith("aarch64", ARM::ISAKind::AARCH64)
      .StartsWith("arm64", ARM::ISAKind::AARCH64)
      .StartsWith("thumb", ARM::ISAKind::THUMB)
      .StartsWith("arm", ARM::ISAKind::ARM)
      .Default(ARM::ISAKind::INVALID);
}